

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

int __thiscall ON_XMLVariant::AsInteger(ON_XMLVariant *this)

{
  int iVar1;
  wchar_t *s;
  ON_XMLVariant *this_local;
  
  switch(this->_private->_type) {
  case Bool:
    this_local._4_4_ = (uint)(((this->_private->field_2)._bool_val & 1U) != 0);
    break;
  case Integer:
    this_local._4_4_ = (this->_private->field_2)._int_val;
    break;
  case Float:
    this_local._4_4_ = (uint)(this->_private->field_2)._float_val;
    break;
  case Double:
    this_local._4_4_ = (uint)(this->_private->field_2)._double_val;
    break;
  case String:
    iVar1 = ON_wString::CompareNoCase(&this->_private->_string_val,L"true");
    if (iVar1 == 0) {
      this_local._4_4_ = 1;
    }
    else {
      iVar1 = ON_wString::CompareNoCase(&this->_private->_string_val,L"t");
      if (iVar1 == 0) {
        this_local._4_4_ = 1;
      }
      else {
        s = ON_wString::operator_cast_to_wchar_t_(&this->_private->_string_val);
        this_local._4_4_ = ON_wtoi(s);
      }
    }
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_XMLVariant::AsInteger(void) const
{
  switch (_private->_type)
  {
  case Types::Bool:    return     _private->_bool_val ? 1 : 0;
  case Types::Integer: return     _private->_int_val;
  case Types::Double:  return int(_private->_double_val);
  case Types::Float:   return int(_private->_float_val);

  case Types::String:
    if (_private->_string_val.CompareNoCase(L"true") == 0) return 1;
    if (_private->_string_val.CompareNoCase(L"t") == 0) return true;
    return ON_wtoi(_private->_string_val);

  default:
    return 0;
  }
}